

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quoting.cpp
# Opt level: O2

pair<std::shared_ptr<SchemeObject>,_bool> *
do_quote(pair<std::shared_ptr<SchemeObject>,_bool> *__return_storage_ptr__,shared_ptr<ASTNode> *node
        ,Context *context,int quasi_level)

{
  ast_type_t aVar1;
  ASTNode *this;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  _List_iterator<std::shared_ptr<ASTNode>_> __tmp;
  element_type *peVar9;
  eval_error *peVar10;
  _List_node_base *p_Var11;
  int iVar12;
  reverse_iterator j;
  _List_node_base *p_Var13;
  shared_ptr<SchemePair> sVar14;
  bool dotted;
  int local_dc;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> to_insert;
  shared_ptr<SchemePair> sublst;
  pair<std::shared_ptr<SchemeObject>,_bool> quoted;
  shared_ptr<SchemePair> lst;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  aVar1 = this->type;
  if (aVar1 - INT < 5) {
    ASTNode::evaluate((ExecutionResult *)&quoted,this,context);
    ExecutionResult::force_value((ExecutionResult *)&to_insert);
    p_Var11 = to_insert.
              super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev;
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             to_insert.
             super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11;
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    __return_storage_ptr__->second = false;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &to_insert.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev);
    ExecutionResult::~ExecutionResult((ExecutionResult *)&quoted);
    return __return_storage_ptr__;
  }
  if (aVar1 == NAME) {
    std::make_shared<SchemeSymbol,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lst);
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&quoted,
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&to_insert);
    _Var7 = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var7._M_pi;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __return_storage_ptr__->second = false;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &to_insert.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev);
    goto LAB_00136354;
  }
  std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&lst);
  peVar9 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_dc = quasi_level;
  if (((0 < quasi_level) &&
      ((peVar9->list).
       super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
       _M_impl._M_node._M_size != 0)) &&
     (piVar2 = *(int **)((long)(peVar9->list).
                               super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next + 0x10), *piVar2 == 1)
     ) {
    std::__cxx11::string::string((string *)&quoted,(string *)(piVar2 + 2));
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &quoted,"unquote");
    local_dc = 1;
    if (bVar8) {
      if (quasi_level == 1) {
        peVar9 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar9->list).
            super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
            _M_impl._M_node._M_size != 2) {
          peVar10 = (eval_error *)__cxa_allocate_exception(0x10);
          eval_error::runtime_error(peVar10,"unquote: one argument required");
LAB_001364c5:
          __cxa_throw(peVar10,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ASTNode::evaluate((ExecutionResult *)&to_insert,
                          (ASTNode *)
                          (*(_List_node_base **)
                            ((long)&(peVar9->list).
                                    super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                    ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context)
        ;
        ExecutionResult::force_value((ExecutionResult *)&sublst);
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = &(sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_SchemeObject;
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __return_storage_ptr__->second = false;
LAB_001363d7:
        sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        ExecutionResult::~ExecutionResult((ExecutionResult *)&to_insert);
        bVar8 = false;
      }
      else {
LAB_001363ea:
        local_dc = quasi_level + -1;
        bVar8 = true;
      }
    }
    else {
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &quoted,"unquote-splicing");
      if (bVar8) {
        if (quasi_level != 1) goto LAB_001363ea;
        peVar9 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar9->list).
            super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
            _M_impl._M_node._M_size != 2) {
          peVar10 = (eval_error *)__cxa_allocate_exception(0x10);
          eval_error::runtime_error(peVar10,"unquote-splicing: one argument required");
          goto LAB_001364c5;
        }
        ASTNode::evaluate((ExecutionResult *)&to_insert,
                          (ASTNode *)
                          (*(_List_node_base **)
                            ((long)&(peVar9->list).
                                    super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                    ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context)
        ;
        ExecutionResult::force_value((ExecutionResult *)&sublst);
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = &(sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_SchemeObject;
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __return_storage_ptr__->second = true;
        goto LAB_001363d7;
      }
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &quoted,"quasiquote");
      local_dc = (uint)bVar8 + quasi_level;
      bVar8 = true;
    }
    std::__cxx11::string::~string((string *)&quoted);
    if (!bVar8) goto LAB_00136354;
    peVar9 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  dotted = false;
  iVar12 = 0;
  for (p_Var11 = (_List_node_base *)&peVar9->list;
      p_Var11 !=
      (peVar9->list).
      super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>._M_impl
      ._M_node.super__List_node_base._M_next; p_Var11 = p_Var11->_M_prev) {
    std::__shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2> *)(p_Var11->_M_prev + 1)
              );
    do_quote(&quoted,(shared_ptr<ASTNode> *)&local_40,context,local_dc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (quoted.second == true) {
      to_insert.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&to_insert;
      to_insert.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node._M_size = 0;
      to_insert.
      super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&to_insert;
      while (p_Var13 = (_List_node_base *)&to_insert,
            quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        sVar14 = std::dynamic_pointer_cast<SchemePair,SchemeObject>
                           ((shared_ptr<SchemeObject> *)&sublst);
        if (sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          peVar10 = (eval_error *)
                    __cxa_allocate_exception
                              (0x10,0,sVar14.
                                      super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi._M_pi);
          eval_error::runtime_error
                    (peVar10,"unquote-slicing: the expression did not evaluate to a list");
          __cxa_throw(peVar10,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::
        list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        push_back(&to_insert,
                  &(sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car);
        std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&quoted,
                   &((sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr
                    ).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      for (; p_Var13 !=
             to_insert.
             super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
             ._M_impl._M_node.super__List_node_base._M_next; p_Var13 = p_Var13->_M_prev) {
        prepend_value(&lst,(shared_ptr<SchemeObject> *)(p_Var13->_M_prev + 1),&dotted);
        iVar12 = iVar12 + 1;
      }
      std::__cxx11::
      _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
      _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)&to_insert);
    }
    else {
      p_Var13 = p_Var11->_M_prev[1]._M_next;
      if ((*(int *)&p_Var13->_M_next == 1) &&
         (bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var13->_M_prev,"."), bVar8)) {
        if (iVar12 != 1) {
          peVar10 = (eval_error *)__cxa_allocate_exception(0x10);
          eval_error::runtime_error(peVar10,"Invalid dotted sequence");
          __cxa_throw(peVar10,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var3 = ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
                 super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        peVar4 = ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
                 super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
                 super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
        super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
             super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
        super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
        ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
        super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        ((lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
        super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
        dotted = true;
        iVar12 = 2;
      }
      else {
        prepend_value(&lst,&quoted.first,&dotted);
        iVar12 = iVar12 + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar9 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar9->type == VECTOR) {
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>);
    SchemeVector::from_list((SchemeVector *)&sublst,(shared_ptr<SchemePair> *)&local_50);
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    to_insert.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&quoted,
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&to_insert);
    _Var7 = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var7._M_pi;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __return_storage_ptr__->second = false;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &to_insert.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var6 = &local_50;
  }
  else {
    std::__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SchemePair,void>
              ((__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2> *)&to_insert,
               &lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&quoted,
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&to_insert);
    _Var7 = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var7._M_pi;
    quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __return_storage_ptr__->second = false;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var6 = (__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)
             &to_insert.
              super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
LAB_00136354:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<SchemeObject>, bool>
do_quote(std::shared_ptr<ASTNode> node, const Context &context, int quasi_level)
{
    if(node->type == ast_type_t::STRING || node->type == ast_type_t::INT || node->type == ast_type_t::FLOAT ||
       node->type == ast_type_t::BOOL || node->type == ast_type_t::CHAR)
    {
        return {node->evaluate(context).force_value(), false};
    }
    if(node->type == ast_type_t::NAME)
    {
        return {to_object(std::make_shared<SchemeSymbol>(node->value)), false};
    }
    auto lst = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    if(quasi_level > 0 && node->list.size() && node->list.front()->type == ast_type_t::NAME)
    {
        auto head = node->list.front()->value;
        if(head == "unquote")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote: one argument required");
                return {node->list.back()->evaluate(context).force_value(), false};
            }
            --quasi_level;
        }
        else if(head == "unquote-splicing")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote-splicing: one argument required");
                return {node->list.back()->evaluate(context).force_value(), true};
            }
            --quasi_level;
        }
        else if(head == "quasiquote")
            ++quasi_level;
    }
    int taken = 0;
    bool dotted = false;
    for(auto i = node->list.rbegin(); i != node->list.rend(); ++i)
    {
        auto quoted = do_quote(*i, context, quasi_level);
        if(quoted.second)
        {
            std::list<std::shared_ptr<SchemeObject>> to_insert;
            while(quoted.first != scheme_nil)
            {
                auto sublst = std::dynamic_pointer_cast<SchemePair>(quoted.first);
                if(!sublst)
                    throw eval_error("unquote-slicing: the expression did not evaluate to a list");
                to_insert.push_back(sublst->car);
                quoted.first = sublst->cdr;
            }
            for(auto j = to_insert.rbegin(); j != to_insert.rend(); ++j)
            {
                prepend_value(lst, *j, dotted);
                ++taken;
            }
        }
        else if((*i)->type == ast_type_t::NAME && (*i)->value == ".")
        {
            if(taken != 1)
                throw eval_error("Invalid dotted sequence");
            std::swap(lst->car, lst->cdr);
            dotted = true;
            ++taken;
        }
        else
        {
            prepend_value(lst, quoted.first, dotted);
            ++taken;
        }
    }
    if(node->type == ast_type_t::VECTOR)
        return {to_object(SchemeVector::from_list(lst)), false};
    return {to_object(lst), false};
}